

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_add_conn(mg_mgr *mgr,mg_connection *c)

{
  mg_connection *c_local;
  mg_mgr *mgr_local;
  
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_add_conn");
    cs_log_printf("%p %p",mgr,c);
  }
  c->mgr = mgr;
  c->next = mgr->active_connections;
  mgr->active_connections = c;
  c->prev = (mg_connection *)0x0;
  if (c->next != (mg_connection *)0x0) {
    c->next->prev = c;
  }
  mg_ev_mgr_add_conn(c);
  return;
}

Assistant:

MG_INTERNAL void mg_add_conn(struct mg_mgr *mgr, struct mg_connection *c) {
    DBG(("%p %p", mgr, c));
    c->mgr = mgr;
    c->next = mgr->active_connections;
    mgr->active_connections = c;
    c->prev = NULL;
    if (c->next != NULL) c->next->prev = c;
    mg_ev_mgr_add_conn(c);
}